

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O3

void roaring_add_offset_test(void **state_)

{
  void *pvVar1;
  long offset;
  roaring_bitmap_t *prVar2;
  long offset_00;
  
  pvVar1 = *state_;
  offset = *(long *)((long)pvVar1 + 0x18);
  prVar2 = roaring_bitmap_add_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x20),offset);
  *(roaring_bitmap_t **)((long)pvVar1 + 0x28) = prVar2;
  assert_roaring_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x20),prVar2,offset);
  offset_00 = -offset;
  prVar2 = roaring_bitmap_add_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x28),offset_00);
  *(roaring_bitmap_t **)((long)pvVar1 + 0x30) = prVar2;
  assert_roaring_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x28),prVar2,offset_00);
  prVar2 = roaring_bitmap_add_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x20),offset_00);
  *(roaring_bitmap_t **)((long)pvVar1 + 0x38) = prVar2;
  assert_roaring_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x20),prVar2,offset_00);
  prVar2 = roaring_bitmap_add_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x38),offset);
  *(roaring_bitmap_t **)((long)pvVar1 + 0x40) = prVar2;
  assert_roaring_offset(*(roaring_bitmap_t **)((long)pvVar1 + 0x38),prVar2,offset);
  return;
}

Assistant:

static void roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    roaring_add_offset_test_case_t test = state->test_case;
    int64_t offset = test.offset;

    state->forward = roaring_bitmap_add_offset(state->in, offset);
    assert_roaring_offset(state->in, state->forward, offset);

    state->back = roaring_bitmap_add_offset(state->forward, -offset);
    assert_roaring_offset(state->forward, state->back, -offset);

    state->neg_forward = roaring_bitmap_add_offset(state->in, -offset);
    assert_roaring_offset(state->in, state->neg_forward, -offset);

    state->neg_back = roaring_bitmap_add_offset(state->neg_forward, offset);
    assert_roaring_offset(state->neg_forward, state->neg_back, offset);
}